

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_contextual_item_text(nk_context *ctx,char *text,int len,nk_flags alignment)

{
  nk_window *pnVar1;
  nk_widget_layout_states nVar2;
  nk_bool nVar3;
  nk_context *in;
  nk_vec2 in_XMM0_Qa;
  nk_rect bounds;
  
  nVar2 = NK_WIDGET_INVALID;
  if (((ctx != (nk_context *)0x0) && (pnVar1 = ctx->current, pnVar1 != (nk_window *)0x0)) &&
     (nVar2 = NK_WIDGET_INVALID, pnVar1->layout != (nk_panel *)0x0)) {
    nVar2 = nk_widget_fitting(&bounds,ctx,in_XMM0_Qa);
    if (nVar2 != NK_WIDGET_INVALID) {
      if (nVar2 == NK_WIDGET_ROM) {
        in = (nk_context *)0x0;
      }
      else {
        in = (nk_context *)0x0;
        if ((pnVar1->layout->flags & 0x1000) == 0) {
          in = ctx;
        }
      }
      nVar2 = NK_WIDGET_INVALID;
      nVar3 = nk_do_button_text(&ctx->last_widget_state,&pnVar1->buffer,bounds,text,len,alignment,
                                NK_BUTTON_DEFAULT,&(ctx->style).contextual_button,&in->input,
                                (ctx->style).font);
      if (nVar3 != 0) {
        nk_contextual_close(ctx);
        nVar2 = NK_WIDGET_VALID;
      }
    }
  }
  return nVar2;
}

Assistant:

NK_API nk_bool
nk_contextual_item_text(struct nk_context *ctx, const char *text, int len,
nk_flags alignment)
{
struct nk_window *win;
const struct nk_input *in;
const struct nk_style *style;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
state = nk_widget_fitting(&bounds, ctx, style->contextual_button.padding);
if (!state) return nk_false;

in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_text(&ctx->last_widget_state, &win->buffer, bounds,
text, len, alignment, NK_BUTTON_DEFAULT, &style->contextual_button, in, style->font)) {
nk_contextual_close(ctx);
return nk_true;
}
return nk_false;
}